

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

string * __thiscall
tinyusdz::value::GetTypeName_abi_cxx11_(string *__return_storage_ptr__,value *this,uint32_t tyid)

{
  bool bVar1;
  value_type *pvVar2;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_40 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ret;
  uint32_t tyid_local;
  
  ret.contained._28_4_ = SUB84(this,0);
  TryGetTypeName_abi_cxx11_(&local_68,(value *)((ulong)this & 0xffffffff),tyid);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40,&local_68);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_68);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar1) {
    pvVar2 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_40);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  }
  else {
    std::__cxx11::to_string(&local_a8,ret.contained._28_4_);
    std::operator+(&local_88,"(GetTypeName) [[Unknown or unimplemented/unsupported type_id: ",
                   &local_a8);
    std::operator+(__return_storage_ptr__,&local_88,"]]");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeName(uint32_t tyid) {
  auto ret = TryGetTypeName(tyid);

  if (!ret) {
    return "(GetTypeName) [[Unknown or unimplemented/unsupported type_id: " +
           std::to_string(tyid) + "]]";
  }

  return ret.value();
}